

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5CsrPoslist(Fts5Cursor *pCsr,int iPhrase,u8 **pa,int *pn)

{
  sqlite3_module *psVar1;
  Fts5Expr *pFVar2;
  Fts5ExprPhrase **ppFVar3;
  long *plVar4;
  Fts5Colset *pFVar5;
  Fts5ExprPhrase *pFVar6;
  int iVar7;
  int iVar8;
  void *__s;
  long lVar9;
  ulong uVar10;
  Fts5Sorter *pSorter;
  Fts5Sorter *pFVar11;
  int iVar12;
  long lVar13;
  int n;
  char *z;
  int local_6c;
  u8 **local_68;
  int *local_60;
  Fts5Expr *local_58;
  char *local_50;
  Fts5Expr *local_48;
  void *local_40;
  long local_38;
  
  pFVar11 = pCsr->pSorter;
  psVar1 = (pCsr->base).pVtab[1].pModule;
  iVar8 = 0;
  if ((pCsr->csrflags & 0x40) != 0) {
    if (*(int *)((long)&psVar1->xColumn + 4) == 0) {
      iVar8 = 0;
    }
    else {
      pFVar2 = pCsr->pExpr;
      iVar12 = pFVar2->nPhrase;
      local_68 = pa;
      local_60 = pn;
      iVar7 = sqlite3_initialize();
      iVar8 = 7;
      if ((iVar7 == 0) &&
         (local_58 = pFVar2, __s = sqlite3Malloc((long)iVar12 << 4), pFVar2 = local_58,
         __s != (void *)0x0)) {
        iVar8 = 0;
        memset(__s,0,(long)local_58->nPhrase << 4);
        iVar12 = pFVar2->nPhrase;
        if (0 < (long)iVar12) {
          ppFVar3 = pFVar2->apExprPhrase;
          lVar9 = 0;
          do {
            plVar4 = *(long **)((long)ppFVar3 + lVar9);
            if ((pFVar11 == (Fts5Sorter *)0x0) &&
               ((((int)plVar4[2] == 0 || (*(long *)(*plVar4 + 0x18) != pFVar2->pRoot->iRowid)) ||
                (*(int *)(*plVar4 + 4) != 0)))) {
              *(undefined4 *)((long)__s + lVar9 * 2 + 0xc) = 1;
            }
            else {
              *(undefined4 *)(plVar4 + 2) = 0;
            }
            lVar9 = lVar9 + 8;
          } while ((long)iVar12 * 8 != lVar9);
        }
        if (0 < *(int *)&psVar1->xBestIndex) {
          uVar10 = 0;
          while (iVar8 = fts5ApiColumnText((Fts5Context *)pCsr,(int)uVar10,&local_50,&local_6c),
                iVar8 == 0) {
            local_48 = pCsr->pExpr;
            local_38 = (uVar10 << 0x20) + -1;
            iVar8 = local_48->nPhrase;
            if (0 < (long)iVar8) {
              ppFVar3 = local_48->apExprPhrase;
              lVar9 = 0;
              do {
                pFVar5 = ppFVar3[lVar9]->pNode->pNear->pColset;
                if (pFVar5 == (Fts5Colset *)0x0) {
LAB_001d11ec:
                  if (*(int *)((long)__s + lVar9 * 0x10 + 0xc) != 0) goto LAB_001d11fb;
                  *(undefined4 *)((long)__s + lVar9 * 0x10 + 8) = 1;
                }
                else {
                  if (0 < (long)pFVar5->nCol) {
                    lVar13 = 0;
                    do {
                      if (uVar10 == (uint)pFVar5->aiCol[lVar13]) goto LAB_001d11ec;
                      lVar13 = lVar13 + 1;
                    } while (pFVar5->nCol != lVar13);
                  }
LAB_001d11fb:
                  *(undefined4 *)((long)__s + lVar9 * 0x10 + 8) = 0;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 != iVar8);
            }
            local_40 = __s;
            if (local_50 == (char *)0x0) {
              iVar8 = 0;
            }
            else {
              iVar8 = (**(code **)(psVar1->xBegin + 0x10))
                                (psVar1->xUpdate,&local_48,4,local_50,local_6c,
                                 fts5ExprPopulatePoslistsCb);
            }
            uVar10 = uVar10 + 1;
            if (((long)*(int *)&psVar1->xBestIndex <= (long)uVar10) || (iVar8 != 0)) break;
          }
        }
      }
      else {
        __s = (void *)0x0;
      }
      sqlite3_free(__s);
      if (pCsr->pSorter == (Fts5Sorter *)0x0) {
        pFVar11 = (Fts5Sorter *)0x0;
        pn = local_60;
        pa = local_68;
      }
      else {
        fts5ExprCheckPoslists(pCsr->pExpr->pRoot,pCsr->pSorter->iRowid);
        pFVar11 = pCsr->pSorter;
        pn = local_60;
        pa = local_68;
      }
    }
    *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xbf;
  }
  if ((pFVar11 == (Fts5Sorter *)0x0) || (*(int *)((long)&psVar1->xColumn + 4) != 0)) {
    pFVar6 = pCsr->pExpr->apExprPhrase[iPhrase];
    if ((pFVar6->pNode->bEof == 0) && (pFVar6->pNode->iRowid == pCsr->pExpr->pRoot->iRowid)) {
      *pa = (pFVar6->poslist).p;
      iVar12 = (pFVar6->poslist).n;
    }
    else {
      *pa = (u8 *)0x0;
      iVar12 = 0;
    }
    *pn = iVar12;
  }
  else {
    if (iPhrase == 0) {
      iVar12 = 0;
    }
    else {
      iVar12 = pFVar11->aIdx[(long)iPhrase + -1];
    }
    *pn = pFVar11->aIdx[iPhrase] - iVar12;
    *pa = pFVar11->aPoslist + iVar12;
  }
  return iVar8;
}

Assistant:

static int fts5CsrPoslist(
  Fts5Cursor *pCsr, 
  int iPhrase, 
  const u8 **pa,
  int *pn
){
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;
  int rc = SQLITE_OK;
  int bLive = (pCsr->pSorter==0);

  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_POSLIST) ){

    if( pConfig->eDetail!=FTS5_DETAIL_FULL ){
      Fts5PoslistPopulator *aPopulator;
      int i;
      aPopulator = sqlite3Fts5ExprClearPoslists(pCsr->pExpr, bLive);
      if( aPopulator==0 ) rc = SQLITE_NOMEM;
      for(i=0; i<pConfig->nCol && rc==SQLITE_OK; i++){
        int n; const char *z;
        rc = fts5ApiColumnText((Fts5Context*)pCsr, i, &z, &n);
        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5ExprPopulatePoslists(
              pConfig, pCsr->pExpr, aPopulator, i, z, n
          );
        }
      }
      sqlite3_free(aPopulator);

      if( pCsr->pSorter ){
        sqlite3Fts5ExprCheckPoslists(pCsr->pExpr, pCsr->pSorter->iRowid);
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_POSLIST);
  }

  if( pCsr->pSorter && pConfig->eDetail==FTS5_DETAIL_FULL ){
    Fts5Sorter *pSorter = pCsr->pSorter;
    int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
    *pn = pSorter->aIdx[iPhrase] - i1;
    *pa = &pSorter->aPoslist[i1];
  }else{
    *pn = sqlite3Fts5ExprPoslist(pCsr->pExpr, iPhrase, pa);
  }

  return rc;
}